

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_poc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uint_fast8_t *val;
  int iVar2;
  uint_fast8_t tmp;
  jpc_cstate_t *local_38;
  
  iVar2 = 0;
  iVar1 = (int)(ms->len / ((ulong)(0x100 < cstate->numcomps) * 2 + 7));
  (ms->parms).soc = iVar1;
  local_38 = cstate;
  val = (uint_fast8_t *)jas_alloc2((long)iVar1,0x20);
  (ms->parms).sot.len = (uint_fast32_t)val;
  if (val == (uint_fast8_t *)0x0) {
LAB_0011a92f:
    jpc_poc_destroyparms(ms);
    iVar1 = -1;
  }
  else {
    for (; iVar2 < (ms->parms).soc; iVar2 = iVar2 + 1) {
      iVar1 = jpc_getuint8(in,val + 1);
      if (iVar1 != 0) goto LAB_0011a92f;
      if (local_38->numcomps < 0x101) {
        iVar1 = jpc_getuint8(in,&tmp);
        if (iVar1 != 0) goto LAB_0011a92f;
        *(ulong *)(val + 8) = (ulong)tmp;
      }
      else {
        iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 8));
        if (iVar1 != 0) goto LAB_0011a92f;
      }
      iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 0x18));
      if (iVar1 != 0) goto LAB_0011a92f;
      iVar1 = jpc_getuint8(in,val + 2);
      if (iVar1 != 0) goto LAB_0011a92f;
      if (local_38->numcomps < 0x101) {
        iVar1 = jpc_getuint8(in,&tmp);
        if (iVar1 != 0) goto LAB_0011a92f;
        *(ulong *)(val + 0x10) = (ulong)tmp;
      }
      else {
        iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 0x10));
        if (iVar1 != 0) goto LAB_0011a92f;
      }
      iVar1 = jpc_getuint8(in,val);
      if (((iVar1 != 0) || (val[2] < val[1])) || (*(ulong *)(val + 0x10) < *(ulong *)(val + 8)))
      goto LAB_0011a92f;
      val = val + 0x20;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int jpc_poc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	uint_fast8_t tmp;
	poc->numpchgs = (cstate->numcomps > 256) ? (ms->len / 9) :
	  (ms->len / 7);
	if (!(poc->pchgs = jas_alloc2(poc->numpchgs, sizeof(jpc_pocpchg_t)))) {
		goto error;
	}
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_getuint8(in, &pchg->rlvlnostart)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnostart)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			};
			pchg->compnostart = tmp;
		}
		if (jpc_getuint16(in, &pchg->lyrnoend) ||
		  jpc_getuint8(in, &pchg->rlvlnoend)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnoend)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			}
			pchg->compnoend = tmp;
		}
		if (jpc_getuint8(in, &pchg->prgord)) {
			goto error;
		}
		if (pchg->rlvlnostart > pchg->rlvlnoend ||
		  pchg->compnostart > pchg->compnoend) {
			goto error;
		}
	}
	return 0;

error:
	jpc_poc_destroyparms(ms);
	return -1;
}